

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua_state_54.cpp
# Opt level: O2

vector<lua_State_*,_std::allocator<lua_State_*>_> *
FindAllCoroutine_lua54
          (vector<lua_State_*,_std::allocator<lua_State_*>_> *__return_storage_ptr__,lua_State *L)

{
  lua_State *plVar1;
  lua_State *local_20;
  
  (__return_storage_ptr__->super__Vector_base<lua_State_*,_std::allocator<lua_State_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<lua_State_*,_std::allocator<lua_State_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<lua_State_*,_std::allocator<lua_State_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  plVar1 = (lua_State *)&L->l_G->allgc;
  while (plVar1 = (lua_State *)plVar1->next, plVar1 != (lua_State *)0x0) {
    if (plVar1->tt == '\b') {
      local_20 = plVar1;
      std::vector<lua_State*,std::allocator<lua_State*>>::emplace_back<lua_State*>
                ((vector<lua_State*,std::allocator<lua_State*>> *)__return_storage_ptr__,&local_20);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<lua_State*> FindAllCoroutine_lua54(lua_State* L)
{
	std::vector<lua_State*> result;
	auto head = G(L)->allgc;

	while (head)
	{
		if (head->tt == LUA_TTHREAD)
		{
			result.push_back(reinterpret_cast<lua_State*>(head));
		}
		head = head->next;
	}

	return result;
}